

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_nex.cpp
# Opt level: O3

void dirNexScreenTile(void)

{
  byte bVar1;
  bool bVar5;
  undefined4 in_ECX;
  int iVar6;
  char *badValueMessage;
  char *message;
  undefined1 auVar7 [16];
  aint tileArgs [5];
  bool optionals [5];
  undefined8 local_28;
  undefined8 uStack_20;
  uint local_18;
  bool local_10 [8];
  byte bVar2;
  byte bVar3;
  byte bVar4;
  
  local_28 = 0;
  uStack_20 = 0;
  local_18 = 1;
  local_10[4] = true;
  local_10[0] = false;
  local_10[1] = false;
  local_10[2] = false;
  local_10[3] = false;
  bVar5 = getIntArguments<5>(&lp,(aint (*) [5])&local_28,(bool (*) [5])local_10);
  auVar7._0_4_ = -(uint)(-0x7fffff01 < (int)((uint)local_28 ^ 0x80000000));
  auVar7._4_4_ = -(uint)(-0x7fffff01 < (int)(local_28._4_4_ ^ 0x80000000));
  auVar7._8_4_ = -(uint)(-0x7fffff01 < (int)((uint)uStack_20 ^ 0x80000000));
  auVar7._12_4_ = -(uint)(-0x7fffff01 < (int)(uStack_20._4_4_ ^ 0x80000000));
  iVar6 = movmskps(in_ECX,auVar7);
  if (((iVar6 == 0) && (bVar5)) && (local_18 < 2)) {
    if (nex.reqFileVersion != 2) {
      nex.minFileVersion = 3;
      SNexFile::writePalette(&nex);
      nex.h.screen = nex.h.screen | 0x40;
      nex.h.screen2 = '\x03';
      bVar1 = ((local_28 & 0xff) != 0) * (((ushort)local_28 & 0xff) < 0x100) * (char)local_28 -
              (0xff < ((ushort)local_28 & 0xff));
      bVar2 = ((local_28 & 0xff00000000) != 0) * ((local_28._4_2_ & 0xff) < 0x100) *
              (char)(local_28 >> 0x20) - (0xff < (local_28._4_2_ & 0xff));
      bVar3 = ((uStack_20 & 0xff) != 0) * (((ushort)uStack_20 & 0xff) < 0x100) * (char)uStack_20 -
              (0xff < ((ushort)uStack_20 & 0xff));
      bVar4 = ((uStack_20 & 0xff00000000) != 0) * ((uStack_20._4_2_ & 0xff) < 0x100) *
              (char)(uStack_20 >> 0x20) - (0xff < (uStack_20._4_2_ & 0xff));
      nex.h.tilesScrConfig[0] = (bVar1 != 0) * (bVar1 < 0x100) * bVar1 - (0xff < bVar1);
      nex.h.tilesScrConfig[1] = (bVar2 != 0) * (bVar2 < 0x100) * bVar2 - (0xff < bVar2);
      nex.h.tilesScrConfig[2] = (bVar3 != 0) * (bVar3 < 0x100) * bVar3 - (0xff < bVar3);
      nex.h.tilesScrConfig[3] = (bVar4 != 0) * (bVar4 < 0x100) * bVar4 - (0xff < bVar4);
      if (local_18 == 0) {
        nex.h.screen2 = '\x03';
        return;
      }
      saveBank(0,5,false);
      return;
    }
    message = "[SAVENEX] V1.2 was requested with OPEN, but tilemap screen is V1.3 feature.";
    badValueMessage = (char *)0x0;
  }
  else {
    message = 
    "[SAVENEX] expected syntax is TILE <NextReg $6B>,<NextReg $6C>,<NextReg $6E>,<NextReg $6F>[,<AlsoStoreBank5 0/1 = 1>]"
    ;
    badValueMessage = bp;
  }
  Error(message,badValueMessage,SUPPRESS);
  return;
}

Assistant:

static void dirNexScreenTile() {
// ;; SCREEN TILE <NextReg $6B>,<NextReg $6C>,<NextReg $6E>,<NextReg $6F>[,<AlsoStoreBank5 0/1 = 1>]
	// parse arguments
	aint tileArgs[5] = {0, 0, 0, 0, 1};
	const bool optionals[] = {false, false, false, false, true};
	if (!getIntArguments<5>(lp, tileArgs, optionals)
			|| tileArgs[0] < 0 || 255 < tileArgs[0]
			|| tileArgs[1] < 0 || 255 < tileArgs[1]
			|| tileArgs[2] < 0 || 255 < tileArgs[2]
			|| tileArgs[3] < 0 || 255 < tileArgs[3]
			|| tileArgs[4] < 0 || 1 < tileArgs[4]) {
		Error("[SAVENEX] expected syntax is TILE <NextReg $6B>,<NextReg $6C>,<NextReg $6E>,<NextReg $6F>[,<AlsoStoreBank5 0/1 = 1>]", bp, SUPPRESS);
		return;
	}
	// check file version and set it up to V1.3
	if (2 == nex.reqFileVersion) {
		Error("[SAVENEX] V1.2 was requested with OPEN, but tilemap screen is V1.3 feature.", NULL, SUPPRESS);
		return;
	}
	nex.minFileVersion = 3;
	// write palette into file (or update nex.h.screen with NOPAL flag if no palette was defined)
	nex.writePalette();
	nex.h.screen |= SNexHeader::SCR_EXT2;
	nex.h.screen2 = SNexHeader::SCR2_tilemap;
	nex.h.tilesScrConfig[0] = static_cast<byte>(tileArgs[0]);
	nex.h.tilesScrConfig[1] = static_cast<byte>(tileArgs[1]);
	nex.h.tilesScrConfig[2] = static_cast<byte>(tileArgs[2]);
	nex.h.tilesScrConfig[3] = static_cast<byte>(tileArgs[3]);
	// write Bank 5 into file, if requested/default
	if (0 == tileArgs[4]) return;		// suppressed
	saveBank(getNexBankIndex(5), 5);
}